

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O3

void cppwinrt::write_forward(writer *w,TypeDef *type)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  category cVar4;
  int iVar5;
  size_type __rlen;
  ulong uVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  type_name type_name;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  type_name local_120;
  anon_class_8_1_89897ddb_conflict2 local_100;
  undefined1 local_f8 [40];
  long *local_d0;
  FieldSig local_c8;
  
  cppwinrt::type_name::type_name(&local_120,type);
  cVar4 = winmd::reader::get_category(type);
  if (cVar4 == enum_type) {
    local_f8._32_8_ = 0x16;
    local_d0 = (long *)0x17a4fa;
    winmd::reader::row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_f8,
               &type->super_row_base<winmd::reader::TypeDef>,4);
    winmd::reader::Field::Signature(&local_c8,(Field *)local_f8);
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)(local_f8 + 0x20),
               &local_120.name,(TypeSig *)((long)&local_c8 + 0x20));
    if (local_c8.m_type.m_array_sizes.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.m_type.m_array_sizes.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.m_type.m_array_sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.m_type.m_array_sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__detail::__variant::
    _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
    ::~_Variant_storage((_Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                         *)&local_c8.m_type.m_type);
    if (local_c8.m_type.m_cmod.
        super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.m_type.m_cmod.
                      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.m_type.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.m_type.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.m_cmod.
        super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_c8.m_cmod.
                    super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.m_cmod.
                             super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (uint32_t)
                             local_c8.m_cmod.
                             super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                    (long)local_c8.m_cmod.
                          super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  local_c8._0_8_ = (table_base *)0x1b;
  local_c8.m_cmod.
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x17a511;
  bVar3 = operator==(&local_120,(string_view *)&local_c8);
  if (bVar3) {
    return;
  }
  local_f8._0_8_ = (database *)0x1b;
  local_f8._8_8_ = "Windows.Foundation.TimeSpan";
  bVar3 = operator==(&local_120,(string_view *)local_f8);
  pcVar7 = local_120.name._M_str;
  if (bVar3) {
    return;
  }
  if ((local_120.name_space._M_len != 0x1b) ||
     (auVar9[0] = -(local_120.name_space._M_str[0xb] == 'n'),
     auVar9[1] = -(local_120.name_space._M_str[0xc] == 'd'),
     auVar9[2] = -(local_120.name_space._M_str[0xd] == 'a'),
     auVar9[3] = -(local_120.name_space._M_str[0xe] == 't'),
     auVar9[4] = -(local_120.name_space._M_str[0xf] == 'i'),
     auVar9[5] = -(local_120.name_space._M_str[0x10] == 'o'),
     auVar9[6] = -(local_120.name_space._M_str[0x11] == 'n'),
     auVar9[7] = -(local_120.name_space._M_str[0x12] == '.'),
     auVar9[8] = -(local_120.name_space._M_str[0x13] == 'N'),
     auVar9[9] = -(local_120.name_space._M_str[0x14] == 'u'),
     auVar9[10] = -(local_120.name_space._M_str[0x15] == 'm'),
     auVar9[0xb] = -(local_120.name_space._M_str[0x16] == 'e'),
     auVar9[0xc] = -(local_120.name_space._M_str[0x17] == 'r'),
     auVar9[0xd] = -(local_120.name_space._M_str[0x18] == 'i'),
     auVar9[0xe] = -(local_120.name_space._M_str[0x19] == 'c'),
     auVar9[0xf] = -(local_120.name_space._M_str[0x1a] == 's'),
     auVar8[0] = -(*local_120.name_space._M_str == 'W'),
     auVar8[1] = -(local_120.name_space._M_str[1] == 'i'),
     auVar8[2] = -(local_120.name_space._M_str[2] == 'n'),
     auVar8[3] = -(local_120.name_space._M_str[3] == 'd'),
     auVar8[4] = -(local_120.name_space._M_str[4] == 'o'),
     auVar8[5] = -(local_120.name_space._M_str[5] == 'w'),
     auVar8[6] = -(local_120.name_space._M_str[6] == 's'),
     auVar8[7] = -(local_120.name_space._M_str[7] == '.'),
     auVar8[8] = -(local_120.name_space._M_str[8] == 'F'),
     auVar8[9] = -(local_120.name_space._M_str[9] == 'o'),
     auVar8[10] = -(local_120.name_space._M_str[10] == 'u'),
     auVar8[0xb] = -(local_120.name_space._M_str[0xb] == 'n'),
     auVar8[0xc] = -(local_120.name_space._M_str[0xc] == 'd'),
     auVar8[0xd] = -(local_120.name_space._M_str[0xd] == 'a'),
     auVar8[0xe] = -(local_120.name_space._M_str[0xe] == 't'),
     auVar8[0xf] = -(local_120.name_space._M_str[0xf] == 'i'), auVar8 = auVar8 & auVar9,
     (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff)) goto switchD_001175ec_caseD_6;
  switch(local_120.name._M_len) {
  case 5:
    pcVar7 = "Plane";
    goto LAB_00117688;
  case 7:
    iVar5 = bcmp(local_120.name._M_str,"Vector2",local_120.name._M_len);
    if (iVar5 == 0) {
      return;
    }
    if (*(int *)((long)pcVar7 + 3) == 0x33726f74 && *(int *)pcVar7 == 0x74636556) {
      return;
    }
    if (*(int *)((long)pcVar7 + 3) == 0x34726f74 && *(int *)pcVar7 == 0x74636556) {
      return;
    }
    break;
  case 9:
    if ((char)*(long *)((long)local_120.name._M_str + 8) == '2' &&
        *(long *)local_120.name._M_str == 0x783378697274614d) {
      return;
    }
    if ((char)*(long *)((long)local_120.name._M_str + 8) == '4' &&
        *(long *)local_120.name._M_str == 0x783478697274614d) {
      return;
    }
    break;
  case 10:
    pcVar7 = "Quaternion";
LAB_00117688:
    iVar5 = bcmp(local_120.name._M_str,pcVar7,local_120.name._M_len);
    if (iVar5 == 0) {
      return;
    }
  }
switchD_001175ec_caseD_6:
  local_f8._0_8_ = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  uVar1 = (type->super_row_base<winmd::reader::TypeDef>).m_index * 2 + 2;
  local_f8._8_4_ = uVar1;
  winmd::reader::
  equal_range<winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::coded_index<winmd::reader::TypeOrMethodDef>>
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_c8,
             (reader *)
             &((((database *)local_f8._0_8_)->TypeRef).super_table_base.m_database)->GenericParam,
             (table<winmd::reader::GenericParam> *)local_f8,
             (coded_index<winmd::reader::TypeOrMethodDef> *)(ulong)uVar1);
  if (((pointer)local_c8._0_8_ ==
       local_c8.m_cmod.
       super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((uint32_t)
      local_c8.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (uint32_t)
      local_c8.m_cmod.
      super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    local_f8._0_8_ = (database *)0xe;
    local_f8._8_8_ = "    struct %;\n";
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_f8,&local_120.name);
  }
  else {
    local_f8._0_8_ = (database *)0x32;
    local_f8._8_8_ = "    template <%> struct WINRT_IMPL_EMPTY_BASES %;\n";
    uVar6 = local_120.name._M_len;
    if (local_120.name._M_len == 0) {
LAB_0011758b:
      local_f8._32_8_ = 0xffffffffffffffff;
    }
    else {
      do {
        local_f8._32_8_ = uVar6 - 1;
        if (uVar6 == 0) goto LAB_0011758b;
        lVar2 = uVar6 - 1;
        uVar6 = local_f8._32_8_;
      } while (*(char *)((long)local_120.name._M_str + lVar2) != '`');
    }
    if (local_120.name._M_len < (ulong)local_f8._32_8_) {
      local_f8._32_8_ = local_120.name._M_len;
    }
    local_d0 = (long *)local_120.name._M_str;
    local_100.args = (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&local_c8;
    writer_base<cppwinrt::writer>::
    write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>_>
              (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_f8,&local_100,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_f8 + 0x20));
  }
  return;
}

Assistant:

static void write_forward(writer& w, TypeDef const& type)
    {
        type_name type_name(type);

        if (get_category(type) == category::enum_type)
        {
            auto format = R"(    enum class % : %;
)";

            w.write(format, type_name.name, type.FieldList().first.Signature().Type());
            return;
        }

        if (type_name == "Windows.Foundation.DateTime" ||
            type_name == "Windows.Foundation.TimeSpan")
        {
            // Don't forward declare these since they're not structs.
            return;
        }

        if (type_name.name_space == "Windows.Foundation.Numerics")
        {
            if (type_name.name == "Matrix3x2" ||
                type_name.name == "Matrix4x4" ||
                type_name.name == "Plane" ||
                type_name.name == "Quaternion" ||
                type_name.name == "Vector2" ||
                type_name.name == "Vector3" ||
                type_name.name == "Vector4")
            {
                // Don't forward declare these since they're already defined with different names.
                return;
            }
        }

        auto generics = type.GenericParam();

        if (empty(generics))
        {
            auto format = R"(    struct %;
)";

            w.write(format, type_name.name);
            return;
        }

        auto format = R"(    template <%> struct WINRT_IMPL_EMPTY_BASES %;
)";

        w.write(format,
            bind<write_generic_typenames>(generics),
            remove_tick(type_name.name));
    }